

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O3

bool tchecker::dbm::is_universal(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  clock_id_t j;
  ulong uVar4;
  bool bVar5;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,100,
                  "bool tchecker::dbm::is_universal(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  if (dim != 0) {
    uVar1 = (ulong)dim;
    lVar2 = 0;
    uVar3 = 0;
    bVar5 = false;
    do {
      if (dbm[(int)uVar3 * dim + (int)uVar3] != (db_t)0x1) {
        return bVar5;
      }
      uVar4 = 0;
      do {
        if ((uVar3 != uVar4) && (dbm[(uint)((int)lVar2 + (int)uVar4)] != (db_t)0x7ffffffe)) {
          return bVar5;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + uVar1;
      bVar5 = uVar1 <= uVar3;
      if (uVar3 == uVar1) {
        return bVar5;
      }
    } while( true );
  }
  __assert_fail("dim >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x65,
                "bool tchecker::dbm::is_universal(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

bool is_universal(tchecker::dbm::db_t const * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  // <inf everywhere except <=0 on diagonal
  for (tchecker::clock_id_t i = 0; i < dim; ++i) {
    if (DBM(i, i) != tchecker::dbm::LE_ZERO)
      return false;

    for (tchecker::clock_id_t j = 0; j < dim; ++j) {
      if ((i != j) && (DBM(i, j) != tchecker::dbm::LT_INFINITY))
        return false;
    }
  }
  return true;
}